

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Detail::anon_unknown_0::FileStream::FileStream(FileStream *this,StringRef filename)

{
  byte bVar1;
  char *pcVar2;
  ReusableStringStream *pRVar3;
  ReusableStringStream local_68;
  string local_50;
  FileStream *local_20;
  FileStream *this_local;
  StringRef filename_local;
  
  filename_local.m_start = (char *)filename.m_size;
  this_local = (FileStream *)filename.m_start;
  local_20 = this;
  IStream::IStream(&this->super_IStream);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__FileStream_003bb5e0;
  std::ofstream::ofstream(&this->m_ofs);
  pcVar2 = StringRef::c_str((StringRef *)&this_local);
  std::ofstream::open(&this->m_ofs,pcVar2,0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_68);
  pRVar3 = ReusableStringStream::operator<<(&local_68,(char (*) [23])"Unable to open file: \'");
  pRVar3 = ReusableStringStream::operator<<(pRVar3,(StringRef *)&this_local);
  pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [2])0x2f5ab1);
  ReusableStringStream::str_abi_cxx11_(&local_50,pRVar3);
  throw_domain_error(&local_50);
}

Assistant:

FileStream( StringRef filename ) {
                m_ofs.open( filename.c_str() );
                CATCH_ENFORCE( !m_ofs.fail(), "Unable to open file: '" << filename << "'" );
            }